

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceDefaultInstance
          (FileGenerator *this,int idx,Printer *printer)

{
  char *in_RDX;
  int in_ESI;
  Formatter *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  char *in_stack_00000018;
  Formatter *in_stack_00000020;
  MessageGenerator *generator;
  Formatter format;
  Printer *in_stack_000000f8;
  MessageGenerator *in_stack_00000100;
  Printer *in_stack_ffffffffffffff08;
  string local_e8 [32];
  string local_c8 [24];
  Options *in_stack_ffffffffffffff50;
  Descriptor *in_stack_ffffffffffffff58;
  Options *in_stack_ffffffffffffff70;
  Descriptor *in_stack_ffffffffffffff78;
  string local_78 [32];
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Formatter *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  Formatter::Formatter
            (in_RDI,in_stack_ffffffffffffff08,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4d6327);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)&in_RDI[10].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
               (long)in_ESI);
  local_58 = std::
             unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::get((unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                    *)in_RDI);
  DefaultInstanceType_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Formatter::operator()
            ((Formatter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_78);
  Formatter::Indent((Formatter *)0x4d63b7);
  MessageGenerator::GenerateExtraDefaultFields(in_stack_00000100,in_stack_000000f8);
  Formatter::Outdent((Formatter *)0x4d63dd);
  DefaultInstanceName_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Formatter::operator()
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  if ((in_RDI[2].vars_._M_t._M_impl.field_0x2 & 1) != 0) {
    DefaultInstancePtr_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    DefaultInstanceName_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    Formatter::operator()
              (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr
              );
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
  }
  Formatter::~Formatter((Formatter *)0x4d6543);
  return;
}

Assistant:

void FileGenerator::GenerateSourceDefaultInstance(int idx,
                                                  io::Printer* printer) {
  Formatter format(printer, variables_);
  MessageGenerator* generator = message_generators_[idx].get();
  format(
      "class $1$ {\n"
      " public:\n"
      "  ::$proto_ns$::internal::ExplicitlyConstructed<$2$> _instance;\n",
      DefaultInstanceType(generator->descriptor_, options_),
      generator->classname_);
  format.Indent();
  generator->GenerateExtraDefaultFields(printer);
  format.Outdent();
  format("} $1$;\n", DefaultInstanceName(generator->descriptor_, options_));
  if (options_.lite_implicit_weak_fields) {
    format("$1$DefaultTypeInternal* $2$ = &$3$;\n", generator->classname_,
           DefaultInstancePtr(generator->descriptor_, options_),
           DefaultInstanceName(generator->descriptor_, options_));
  }
}